

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_frameProgression * ZSTDMT_getFrameProgression(ZSTDMT_CCtx *mtctx)

{
  int iVar1;
  int iVar2;
  unsigned_long_long uVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  long in_RSI;
  ZSTD_frameProgression *in_RDI;
  size_t flushed;
  size_t produced;
  size_t cResult;
  ZSTDMT_jobDescription *jobPtr;
  uint wJobID;
  uint lastJobNb;
  uint jobNb;
  ulong local_58;
  ulong local_50;
  uint local_c;
  
  in_RDI->ingested = *(long *)(in_RSI + 0xbd0) + *(long *)(in_RSI + 0x130);
  in_RDI->consumed = *(unsigned_long_long *)(in_RSI + 0xbd0);
  uVar3 = *(unsigned_long_long *)(in_RSI + 0xbd8);
  in_RDI->flushed = uVar3;
  in_RDI->produced = uVar3;
  in_RDI->currentJobID = *(uint *)(in_RSI + 3000);
  in_RDI->nbActiveWorkers = 0;
  iVar1 = *(int *)(in_RSI + 3000);
  iVar2 = *(int *)(in_RSI + 0x108);
  if (1 < *(int *)(in_RSI + 0x108)) {
    __assert_fail("mtctx->jobReady <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x892b,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
  }
  local_c = *(uint *)(in_RSI + 0xbb4);
  while( true ) {
    if ((uint)(iVar1 + iVar2) <= local_c) {
      return in_RDI;
    }
    uVar4 = local_c & *(uint *)(in_RSI + 0xbb0);
    puVar6 = (ulong *)(*(long *)(in_RSI + 8) + (ulong)uVar4 * 0x1b8);
    pthread_mutex_lock((pthread_mutex_t *)(puVar6 + 2));
    local_50 = puVar6[1];
    uVar5 = ZSTD_isError(0x17ce95);
    if (uVar5 != 0) {
      local_50 = 0;
    }
    uVar5 = ZSTD_isError(0x17cec1);
    if (uVar5 == 0) {
      local_58 = puVar6[0x35];
    }
    else {
      local_58 = 0;
    }
    if (local_50 < local_58) break;
    in_RDI->ingested = puVar6[0x16] + in_RDI->ingested;
    in_RDI->consumed = *puVar6 + in_RDI->consumed;
    in_RDI->produced = local_50 + in_RDI->produced;
    in_RDI->flushed = local_58 + in_RDI->flushed;
    in_RDI->nbActiveWorkers = (uint)(*puVar6 < puVar6[0x16]) + in_RDI->nbActiveWorkers;
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RSI + 8) + (ulong)uVar4 * 0x1b8 + 0x10));
    local_c = local_c + 1;
  }
  __assert_fail("flushed <= produced",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8935,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
}

Assistant:

ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx* mtctx)
{
    ZSTD_frameProgression fps;
    DEBUGLOG(5, "ZSTDMT_getFrameProgression");
    fps.ingested = mtctx->consumed + mtctx->inBuff.filled;
    fps.consumed = mtctx->consumed;
    fps.produced = fps.flushed = mtctx->produced;
    fps.currentJobID = mtctx->nextJobID;
    fps.nbActiveWorkers = 0;
    {   unsigned jobNb;
        unsigned lastJobNb = mtctx->nextJobID + mtctx->jobReady; assert(mtctx->jobReady <= 1);
        DEBUGLOG(6, "ZSTDMT_getFrameProgression: jobs: from %u to <%u (jobReady:%u)",
                    mtctx->doneJobID, lastJobNb, mtctx->jobReady)
        for (jobNb = mtctx->doneJobID ; jobNb < lastJobNb ; jobNb++) {
            unsigned const wJobID = jobNb & mtctx->jobIDMask;
            ZSTDMT_jobDescription* jobPtr = &mtctx->jobs[wJobID];
            ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
            {   size_t const cResult = jobPtr->cSize;
                size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
                size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
                assert(flushed <= produced);
                fps.ingested += jobPtr->src.size;
                fps.consumed += jobPtr->consumed;
                fps.produced += produced;
                fps.flushed  += flushed;
                fps.nbActiveWorkers += (jobPtr->consumed < jobPtr->src.size);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        }
    }
    return fps;
}